

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  float fVar2;
  float x0;
  float y0;
  ulong uVar3;
  ImVec2 IVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  CustomRect *pCVar8;
  ImFont *pIVar9;
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  int iVar13;
  uint uVar14;
  uint uVar15;
  int y;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  
  iVar13 = atlas->CustomRectIds[0];
  iVar6 = atlas->TexWidth;
  pCVar8 = (atlas->CustomRects).Data;
  if ((atlas->Flags & 2) == 0) {
    iVar16 = 0;
    lVar18 = 0;
    do {
      lVar20 = 0;
      do {
        cVar5 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                [(int)lVar18 + lVar20];
        lVar21 = (long)(int)((uint)pCVar8[iVar13].X + (int)lVar20 +
                            ((uint)pCVar8[iVar13].Y + iVar16) * iVar6);
        atlas->TexPixelsAlpha8[lVar21] = -(cVar5 == '.');
        atlas->TexPixelsAlpha8[lVar21 + 0x6d] = -(cVar5 == 'X');
        lVar20 = lVar20 + 1;
      } while ((int)lVar20 != 0x6c);
      iVar16 = iVar16 + 1;
      lVar18 = (int)lVar18 + lVar20;
    } while (iVar16 != 0x1b);
  }
  else {
    lVar20 = (ulong)pCVar8[iVar13].Y * (long)iVar6 + (ulong)pCVar8[iVar13].X;
    lVar18 = (long)(iVar6 + (int)lVar20);
    atlas->TexPixelsAlpha8[lVar18 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar18] = 0xff;
    atlas->TexPixelsAlpha8[lVar20 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar20] = 0xff;
  }
  pCVar8 = pCVar8 + iVar13;
  uVar3._0_2_ = pCVar8->X;
  uVar3._2_2_ = pCVar8->Y;
  uVar3._4_4_ = pCVar8->GlyphAdvanceX;
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar3;
  auVar10._12_2_ = (short)((uint)uVar3._4_4_ >> 0x10);
  auVar11._8_2_ = (short)uVar3._4_4_;
  auVar11._0_8_ = uVar3;
  auVar11._10_4_ = auVar10._10_4_;
  auVar12._6_8_ = 0;
  auVar12._0_6_ = auVar11._8_6_;
  IVar4 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar4.x * ((float)(ushort)(undefined2)uVar3 + 0.5);
  (atlas->TexUvWhitePixel).y =
       IVar4.y * ((float)(int)CONCAT82(SUB148(auVar12 << 0x40,6),uVar3._2_2_) + 0.5);
  iVar13 = (atlas->CustomRects).Size;
  if (0 < iVar13) {
    lVar18 = 0x18;
    lVar20 = 0;
    do {
      pCVar8 = (atlas->CustomRects).Data;
      pIVar9 = *(ImFont **)((long)&pCVar8->ID + lVar18);
      uVar7 = *(uint *)((long)pCVar8 + lVar18 + -0x18);
      if (uVar7 < 0x10001 && pIVar9 != (ImFont *)0x0) {
        uVar14 = (uint)*(ushort *)((long)pCVar8 + lVar18 + -0x10);
        fVar1 = (atlas->TexUvScale).x;
        fVar2 = (atlas->TexUvScale).y;
        uVar17 = (uint)*(ushort *)((long)pCVar8 + lVar18 + -0xe);
        uVar19 = (uint)*(ushort *)((long)pCVar8 + lVar18 + -0x14);
        uVar15 = (uint)*(ushort *)((long)pCVar8 + lVar18 + -0x12);
        x0 = *(float *)((long)pCVar8 + lVar18 + -8);
        y0 = *(float *)((long)pCVar8 + lVar18 + -4);
        ImFont::AddGlyph(pIVar9,(ImWchar)uVar7,x0,y0,(float)uVar19 + x0,(float)uVar15 + y0,
                         (float)uVar14 * fVar1,(float)uVar17 * fVar2,
                         (float)(uVar14 + uVar19) * fVar1,(float)(uVar17 + uVar15) * fVar2,
                         *(float *)((long)pCVar8 + lVar18 + -0xc));
        iVar13 = (atlas->CustomRects).Size;
      }
      lVar20 = lVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (lVar20 < iVar13);
  }
  iVar13 = (atlas->Fonts).Size;
  if (0 < iVar13) {
    lVar18 = 0;
    do {
      pIVar9 = (atlas->Fonts).Data[lVar18];
      if (pIVar9->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar9);
        iVar13 = (atlas->Fonts).Size;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar13);
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data block
    ImFontAtlasBuildRenderDefaultTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlas::CustomRect& r = atlas->CustomRects[i];
        if (r.Font == NULL || r.ID > 0x10000)
            continue;

        IM_ASSERT(r.Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(&r, &uv0, &uv1);
        r.Font->AddGlyph((ImWchar)r.ID, r.GlyphOffset.x, r.GlyphOffset.y, r.GlyphOffset.x + r.Width, r.GlyphOffset.y + r.Height, uv0.x, uv0.y, uv1.x, uv1.y, r.GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();
}